

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hud.cpp
# Opt level: O0

void __thiscall CHud::RenderCheckpoint(CHud *this)

{
  int iVar1;
  int64 iVar2;
  ITextRender *pIVar3;
  long lVar4;
  long in_RDI;
  long in_FS_OFFSET;
  float Half;
  float a;
  int64 TimeSinceCheckpoint;
  char aBuf [64];
  float in_stack_ffffffffffffff68;
  float in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  float in_stack_ffffffffffffff74;
  long lVar5;
  CTextCursor *in_stack_ffffffffffffff90;
  float local_5c;
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = time_get();
  lVar4 = iVar2 - *(long *)(in_RDI + 0x30);
  if ((*(long *)(in_RDI + 0x30) != 0) && (lVar5 = lVar4, iVar2 = time_freq(), lVar5 < iVar2 * 4)) {
    FormatTimeDiff((char *)in_stack_ffffffffffffff90,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
                   (int)((ulong)lVar5 >> 0x20),SUB81((ulong)lVar5 >> 0x18,0));
    local_5c = 1.0;
    iVar2 = time_freq();
    if (lVar4 != iVar2 * 2 && SBORROW8(lVar4,iVar2 * 2) == lVar4 + iVar2 * -2 < 0) {
      iVar2 = time_freq();
      in_stack_ffffffffffffff74 = (float)(iVar2 * 4 - lVar4);
      iVar2 = time_freq();
      local_5c = in_stack_ffffffffffffff74 / (float)(iVar2 << 1);
    }
    if (*(int *)(in_RDI + 0x28) < 1) {
      if (*(int *)(in_RDI + 0x28) < 0) {
        pIVar3 = CComponent::TextRender((CComponent *)0x1697c3);
        (*(pIVar3->super_IInterface)._vptr_IInterface[4])(0x3f000000,0x3f800000,0x3f000000,local_5c)
        ;
      }
      else if (*(int *)(in_RDI + 0x28) == 0) {
        pIVar3 = CComponent::TextRender((CComponent *)0x1697fc);
        (*(pIVar3->super_IInterface)._vptr_IInterface[4])(0x3f800000,0x3f800000,0x3f800000,local_5c)
        ;
      }
    }
    else {
      pIVar3 = CComponent::TextRender((CComponent *)0x16978a);
      (*(pIVar3->super_IInterface)._vptr_IInterface[4])(0x3f800000,0x3f000000,0x3f000000,local_5c);
    }
    CComponent::Graphics((CComponent *)0x169827);
    IGraphics::ScreenAspect
              ((IGraphics *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    if ((RenderCheckpoint()::s_Cursor == '\0') &&
       (iVar1 = __cxa_guard_acquire(&RenderCheckpoint()::s_Cursor), iVar1 != 0)) {
      CTextCursor::CTextCursor(in_stack_ffffffffffffff90,(float)((ulong)in_RDI >> 0x20),(int)in_RDI)
      ;
      __cxa_atexit(CTextCursor::~CTextCursor,&RenderCheckpoint::s_Cursor,&__dso_handle);
      __cxa_guard_release(&RenderCheckpoint()::s_Cursor);
    }
    RenderCheckpoint::s_Cursor.m_Align = 1;
    CTextCursor::Reset((CTextCursor *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                       CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    CTextCursor::MoveTo((CTextCursor *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70)
                        ,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
    pIVar3 = CComponent::TextRender((CComponent *)0x1698e9);
    (*(pIVar3->super_IInterface)._vptr_IInterface[0xb])
              (pIVar3,&RenderCheckpoint::s_Cursor,local_48,0xffffffff);
    pIVar3 = CComponent::TextRender((CComponent *)0x16990d);
    (*(pIVar3->super_IInterface)._vptr_IInterface[4])(0x3f800000,0x3f800000,0x3f800000);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CHud::RenderCheckpoint()
{
	int64 TimeSinceCheckpoint = time_get() - m_CheckpointTime;
	if(m_CheckpointTime != 0 && TimeSinceCheckpoint < time_freq() * 4)
	{
		char aBuf[64];
		FormatTimeDiff(aBuf, sizeof(aBuf), m_CheckpointDiff, 2);

		// calculate alpha (2 sec 1 than get lower the next 2 sec)
		float a = 1.0f;
		if(TimeSinceCheckpoint > time_freq() * 2)
		{
			// lower the alpha slowly to blend text out
			a = (time_freq() * 4 - TimeSinceCheckpoint) / (float)(time_freq() * 2);
		}

		if(m_CheckpointDiff > 0)
			TextRender()->TextColor(1.0f,0.5f,0.5f,a); // red
		else if(m_CheckpointDiff < 0)
			TextRender()->TextColor(0.5f,1.0f,0.5f,a); // green
		else if(!m_CheckpointDiff)
			TextRender()->TextColor(1,1,1,a); // white

		float Half = 300.0f*Graphics()->ScreenAspect()/2.0f;
		
		static CTextCursor s_Cursor(10);
		s_Cursor.m_Align = TEXTALIGN_TC;
		s_Cursor.Reset();
		s_Cursor.MoveTo(Half, 33);
		TextRender()->TextOutlined(&s_Cursor, aBuf, -1);

		TextRender()->TextColor(1,1,1,1);
	}
}